

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetContentEncodingSystemProperty
          (IOTHUB_MESSAGE_HANDLE iotHubMessageHandle,char *contentEncoding)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_RESULT result;
  char *contentEncoding_local;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle_local;
  
  if ((iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) || (contentEncoding == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetContentEncodingSystemProperty",0x2e5,1,
                "Invalid argument (iotHubMessageHandle=%p, contentEncoding=%p)",iotHubMessageHandle,
                contentEncoding);
    }
    l._4_4_ = IOTHUB_MESSAGE_INVALID_ARG;
  }
  else {
    iVar1 = set_content_encoding(iotHubMessageHandle,contentEncoding);
    if (iVar1 == 0) {
      l._4_4_ = IOTHUB_MESSAGE_OK;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_SetContentEncodingSystemProperty",0x2ec,1,
                  "Failed saving a copy of contentEncoding");
      }
      l._4_4_ = IOTHUB_MESSAGE_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetContentEncodingSystemProperty(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle, const char* contentEncoding)
{
    IOTHUB_MESSAGE_RESULT result;

    if (iotHubMessageHandle == NULL || contentEncoding == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle=%p, contentEncoding=%p)", iotHubMessageHandle, contentEncoding);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        if (set_content_encoding(iotHubMessageHandle, contentEncoding) != 0)
        {
            LogError("Failed saving a copy of contentEncoding");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}